

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_sound_srcs.cxx
# Opt level: O3

void __thiscall xray_re::xr_sound_src_object::~xr_sound_src_object(xr_sound_src_object *this)

{
  ~xr_sound_src_object(this);
  operator_delete(this,0xd0);
  return;
}

Assistant:

xr_sound_src_object::~xr_sound_src_object() {}